

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O2

void quantize_float(JCOEFPTR coef_block,float *divisors,float *workspace)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    coef_block[lVar1] = (short)(int)(workspace[lVar1] * divisors[lVar1] + 16384.5) + -0x4000;
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_float(JCOEFPTR coef_block, FAST_FLOAT *divisors,
               FAST_FLOAT *workspace)
{
  register FAST_FLOAT temp;
  register int i;
  register JCOEFPTR output_ptr = coef_block;

  for (i = 0; i < DCTSIZE2; i++) {
    /* Apply the quantization and scaling factor */
    temp = workspace[i] * divisors[i];

    /* Round to nearest integer.
     * Since C does not specify the direction of rounding for negative
     * quotients, we have to force the dividend positive for portability.
     * The maximum coefficient size is +-16K (for 12-bit data), so this
     * code should work for either 16-bit or 32-bit ints.
     */
    output_ptr[i] = (JCOEF)((int)(temp + (FAST_FLOAT)16384.5) - 16384);
  }
}